

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O1

void __thiscall
BPlusTree<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::erase_node(BPlusTree<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this)

{
  Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pPVar1;
  BPlusTree<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  **ppBVar2;
  size_t index;
  undefined1 local_68 [16];
  int local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this->next = (BPlusTree<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0;
  this->data_size = 0;
  this->subset_size = 0;
  index = 0;
  do {
    if (index != 3) {
      local_68[0] = 0;
      local_58 = 0;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>((string *)local_50,local_68,local_68);
      pPVar1 = b_array::
               Array<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->data,index);
      pPVar1->key = local_58;
      std::__cxx11::string::operator=((string *)&pPVar1->value,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
    ppBVar2 = b_array::
              Array<BPlusTree<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>
              ::operator[](&this->subset,index);
    *ppBVar2 = (BPlusTree<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0;
    index = index + 1;
  } while (index != 4);
  return;
}

Assistant:

void BPlusTree<T>::erase_node() {
    data_size = 0;
    next = nullptr;
    subset_size = 0;
    // null out the subset array before it causes problems
    for (size_t i = 0; i < SUBSET_CAPACITY; ++i) {
        if (i < DATA_CAPACITY)
            data[i] = T();
        subset[i] = nullptr;
    }
}